

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.cpp
# Opt level: O3

void luaS_resize(lua_State *L,int newsize)

{
  GCObject *pGVar1;
  GCObject **__s;
  long lVar2;
  int iVar3;
  long lVar4;
  GCObject *pGVar5;
  ulong uVar6;
  global_State *pgVar7;
  
  if (L->l_G->gcstate != '\x02') {
    if (newsize < -1) {
      __s = (GCObject **)luaM_toobig(L);
      pgVar7 = L->l_G;
    }
    else {
      __s = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize * 8);
      pgVar7 = L->l_G;
      if (0 < newsize) {
        memset(__s,0,(ulong)(uint)newsize << 3);
      }
    }
    iVar3 = (pgVar7->strt).size;
    lVar4 = (long)iVar3;
    if (0 < lVar4) {
      lVar2 = 0;
      do {
        pGVar5 = (pgVar7->strt).hash[lVar2];
        if (pGVar5 != (GCObject *)0x0) {
          do {
            pGVar1 = (pGVar5->gch).next;
            uVar6 = (long)*(int *)((long)pGVar5 + 0xc) & (long)newsize - 1U;
            (pGVar5->gch).next = __s[uVar6];
            __s[uVar6] = pGVar5;
            pGVar5 = pGVar1;
          } while (pGVar1 != (GCObject *)0x0);
          iVar3 = (pgVar7->strt).size;
        }
        lVar2 = lVar2 + 1;
        lVar4 = (long)iVar3;
      } while (lVar2 < lVar4);
    }
    luaM_realloc_(L,(pgVar7->strt).hash,lVar4 << 3,0);
    (pgVar7->strt).size = newsize;
    (pgVar7->strt).hash = __s;
  }
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  GCObject **newhash;
  stringtable *tb;
  int i;
  if (G(L)->gcstate == GCSsweepstring)
    return;  /* cannot resize during GC traverse */
  newhash = luaM_newvector(L, newsize, GCObject *);
  tb = &G(L)->strt;
  for (i=0; i<newsize; i++) newhash[i] = NULL;
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    while (p) {  /* for each node in the list */
      GCObject *next = p->gch.next;  /* save next */
      unsigned int h = gco2ts(p)->hash;
      int h1 = lmod(h, newsize);  /* new position */
      lua_assert(cast_int(h%newsize) == lmod(h, newsize));
      p->gch.next = newhash[h1];  /* chain it */
      newhash[h1] = p;
      p = next;
    }
  }
  luaM_freearray(L, tb->hash, tb->size, TString *);
  tb->size = newsize;
  tb->hash = newhash;
}